

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  uint total;
  int i;
  int j;
  int safe_h;
  uchar buffer [8];
  uint local_30;
  uint local_2c;
  int local_28;
  byte local_20 [8];
  uint local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  iVar1 = in_EDX - in_R8D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_20,0,8);
  for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
    memset(local_20,0,(ulong)local_18);
    local_30 = 0;
    switch(local_18) {
    case 2:
      for (local_2c = 0; (int)local_2c <= iVar1; local_2c = local_2c + 1) {
        local_30 = ((uint)*(byte *)(local_8 + (int)(local_2c * local_14)) -
                   (uint)local_20[(int)(local_2c & 7)]) + local_30;
        local_20[local_2c + local_18 & 7] = *(byte *)(local_8 + (int)(local_2c * local_14));
        *(char *)(local_8 + (int)(local_2c * local_14)) = (char)(local_30 >> 1);
      }
      break;
    case 3:
      for (local_2c = 0; (int)local_2c <= iVar1; local_2c = local_2c + 1) {
        local_30 = ((uint)*(byte *)(local_8 + (int)(local_2c * local_14)) -
                   (uint)local_20[(int)(local_2c & 7)]) + local_30;
        local_20[local_2c + local_18 & 7] = *(byte *)(local_8 + (int)(local_2c * local_14));
        *(char *)(local_8 + (int)(local_2c * local_14)) = (char)((ulong)local_30 / 3);
      }
      break;
    case 4:
      for (local_2c = 0; (int)local_2c <= iVar1; local_2c = local_2c + 1) {
        local_30 = ((uint)*(byte *)(local_8 + (int)(local_2c * local_14)) -
                   (uint)local_20[(int)(local_2c & 7)]) + local_30;
        local_20[local_2c + local_18 & 7] = *(byte *)(local_8 + (int)(local_2c * local_14));
        *(char *)(local_8 + (int)(local_2c * local_14)) = (char)(local_30 >> 2);
      }
      break;
    case 5:
      for (local_2c = 0; (int)local_2c <= iVar1; local_2c = local_2c + 1) {
        local_30 = ((uint)*(byte *)(local_8 + (int)(local_2c * local_14)) -
                   (uint)local_20[(int)(local_2c & 7)]) + local_30;
        local_20[local_2c + local_18 & 7] = *(byte *)(local_8 + (int)(local_2c * local_14));
        *(char *)(local_8 + (int)(local_2c * local_14)) = (char)((ulong)local_30 / 5);
      }
      break;
    default:
      for (local_2c = 0; (int)local_2c <= iVar1; local_2c = local_2c + 1) {
        local_30 = ((uint)*(byte *)(local_8 + (int)(local_2c * local_14)) -
                   (uint)local_20[(int)(local_2c & 7)]) + local_30;
        local_20[local_2c + local_18 & 7] = *(byte *)(local_8 + (int)(local_2c * local_14));
        *(char *)(local_8 + (int)(local_2c * local_14)) = (char)(local_30 / local_18);
      }
    }
    for (; (int)local_2c < local_10; local_2c = local_2c + 1) {
      local_30 = local_30 - local_20[(int)(local_2c & 7)];
      *(char *)(local_8 + (int)(local_2c * local_14)) = (char)(local_30 / local_18);
    }
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_h = h - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < w; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < h; ++i) {
STBTT_assert(pixels[i*stride_in_bytes] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}

pixels += 1;
}
}